

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::Storage::~Storage(Storage *this)

{
  bool bVar1;
  Storage *this_local;
  
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(*(fltSemantics **)this);
  if (bVar1) {
    detail::IEEEFloat::~IEEEFloat((IEEEFloat *)this);
  }
  else {
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(*(fltSemantics **)this);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x2c9);
    }
    detail::DoubleAPFloat::~DoubleAPFloat((DoubleAPFloat *)this);
  }
  return;
}

Assistant:

~Storage() {
      if (usesLayout<IEEEFloat>(*semantics)) {
        IEEE.~IEEEFloat();
        return;
      }
      if (usesLayout<DoubleAPFloat>(*semantics)) {
        Double.~DoubleAPFloat();
        return;
      }
      llvm_unreachable("Unexpected semantics");
    }